

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O3

void CProfileManager::dumpRecursive(CProfileIterator *profileIterator,int spacing)

{
  float fVar1;
  CProfileNode *pCVar2;
  CProfileNode *pCVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  float fVar8;
  undefined4 uVar9;
  float local_68;
  
  pCVar2 = profileIterator->CurrentParent;
  pCVar3 = pCVar2->Child;
  profileIterator->CurrentChild = pCVar3;
  if (pCVar3 != (CProfileNode *)0x0) {
    if (pCVar2->Parent == (CProfileNode *)0x0) {
      fVar8 = Get_Time_Since_Reset();
    }
    else {
      fVar8 = pCVar2->TotalTime;
    }
    iVar4 = FrameCounter;
    iVar7 = spacing;
    if (spacing < 1) {
      puts("----------------------------------");
    }
    else {
      do {
        putchar(0x2e);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      puts("----------------------------------");
      iVar7 = spacing;
      if (0 < spacing) {
        do {
          putchar(0x2e);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
    }
    printf("Profiling: %s (total running time: %.3f ms) ---\n",SUB84((double)fVar8,0),
           profileIterator->CurrentParent->Name);
    pCVar2 = profileIterator->CurrentChild;
    if (pCVar2 == (CProfileNode *)0x0) {
      local_68 = 0.0;
      uVar6 = 0;
    }
    else {
      local_68 = 0.0;
      uVar5 = 0;
      do {
        fVar1 = pCVar2->TotalTime;
        iVar7 = spacing;
        if (0 < spacing) {
          do {
            putchar(0x2e);
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
          pCVar2 = profileIterator->CurrentChild;
        }
        uVar6 = uVar5 + 1;
        local_68 = local_68 + fVar1;
        printf("%d -- %s (%.2f %%) :: %.3f ms / frame (%d calls)\n",
               SUB84((double)(float)((uint)((fVar1 / fVar8) * 100.0) &
                                    -(uint)(1.1920929e-07 < fVar8)),0),(double)fVar1 / (double)iVar4
               ,(ulong)uVar5,pCVar2->Name,(ulong)(uint)pCVar2->TotalCalls);
        pCVar2 = profileIterator->CurrentChild->Sibling;
        profileIterator->CurrentChild = pCVar2;
        uVar5 = uVar6;
      } while (pCVar2 != (CProfileNode *)0x0);
    }
    iVar4 = spacing;
    if (0 < spacing) {
      do {
        putchar(0x2e);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    if (1.1920929e-07 < fVar8) {
      uVar9 = SUB84((double)(((fVar8 - local_68) / fVar8) * 100.0),0);
    }
    else {
      uVar9 = 0;
    }
    printf("%s (%.3f %%) :: %.3f ms\n",uVar9,(double)(fVar8 - local_68),"Unaccounted:");
    if (uVar6 != 0) {
      uVar5 = 0;
      do {
        CProfileIterator::Enter_Child(profileIterator,uVar5);
        dumpRecursive(profileIterator,spacing + 3);
        pCVar2 = profileIterator->CurrentParent->Parent;
        pCVar3 = profileIterator->CurrentParent;
        if (pCVar2 != (CProfileNode *)0x0) {
          profileIterator->CurrentParent = pCVar2;
          pCVar3 = pCVar2;
        }
        profileIterator->CurrentChild = pCVar3->Child;
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
    }
  }
  return;
}

Assistant:

void	CProfileIterator::First(void)
{
	CurrentChild = CurrentParent->Get_Child();
}